

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O3

void __thiscall
wabt::(anonymous_namespace)::CWriter::
Write<wabt::(anonymous_namespace)::StackVar,char_const(&)[7],wabt::(anonymous_namespace)::StackVar,char_const(&)[4],int,char_const(&)[3],wabt::(anonymous_namespace)::Newline>
          (CWriter *this,StackVar *t,char (*u) [7],StackVar *args,char (*args_1) [4],int *args_2,
          char (*args_3) [3],Newline *args_4)

{
  size_t size;
  
  anon_unknown_0::CWriter::Write((CWriter *)this,t);
  size = strlen((char *)args);
  anon_unknown_0::CWriter::WriteData((CWriter *)this,(char *)args,size);
  anon_unknown_0::CWriter::Write((CWriter *)this,(StackVar *)(ulong)(uint)*args_1);
  anon_unknown_0::CWriter::WriteData((CWriter *)this," & ",3);
  anon_unknown_0::CWriter::Writef((CWriter *)this,"%lu",(long)*args_2);
  anon_unknown_0::CWriter::WriteData((CWriter *)this,");",2);
  if (*(int *)(this + 0x94) < 2) {
    anon_unknown_0::CWriter::WriteData((CWriter *)this,"\n",1);
    *(int *)(this + 0x94) = *(int *)(this + 0x94) + 1;
  }
  this[0x90] = (CWriter)0x1;
  return;
}

Assistant:

void Write(T&& t, U&& u, Args&&... args) {
    Write(std::forward<T>(t));
    Write(std::forward<U>(u));
    Write(std::forward<Args>(args)...);
  }